

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

_Bool cf_he_data_pending(Curl_cfilter *cf,Curl_easy *data)

{
  void *pvVar1;
  long lVar2;
  ulong uVar3;
  eyeballer *baller;
  size_t i;
  cf_he_ctx *ctx;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  pvVar1 = cf->ctx;
  if ((cf->field_0x24 & 1) == 0) {
    for (baller = (eyeballer *)0x0; baller < (eyeballer *)0x2;
        baller = (eyeballer *)((long)&baller->name + 1)) {
      lVar2 = *(long *)((long)pvVar1 + (long)baller * 8 + 0x20);
      if (((lVar2 != 0) && (*(long *)(lVar2 + 0x28) != 0)) &&
         (uVar3 = (**(code **)(**(long **)(lVar2 + 0x28) + 0x40))
                            (*(undefined8 *)(lVar2 + 0x28),data), (uVar3 & 1) != 0)) {
        return true;
      }
    }
    cf_local._7_1_ = false;
  }
  else {
    cf_local._7_1_ = (*cf->next->cft->has_data_pending)(cf->next,data);
  }
  return cf_local._7_1_;
}

Assistant:

static bool cf_he_data_pending(struct Curl_cfilter *cf,
                               const struct Curl_easy *data)
{
  struct cf_he_ctx *ctx = cf->ctx;
  size_t i;

  if(cf->connected)
    return cf->next->cft->has_data_pending(cf->next, data);

  for(i = 0; i < CURL_ARRAYSIZE(ctx->baller); i++) {
    struct eyeballer *baller = ctx->baller[i];
    if(!baller || !baller->cf)
      continue;
    if(baller->cf->cft->has_data_pending(baller->cf, data))
      return TRUE;
  }
  return FALSE;
}